

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

char * make_METAL_srcarg_string(Context *ctx,size_t idx,int writemask,char *buf,size_t buflen)

{
  RegisterType RVar1;
  uint uVar2;
  MOJOSHADER_shaderType shader_type;
  uint uVar3;
  VariableList *pVVar4;
  undefined1 auVar5 [4];
  int iVar6;
  char *pcVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  char local_d8 [56];
  undefined8 uStack_a0;
  char acStack_98 [8];
  char rel_offset [32];
  char local_68 [8];
  char swiz_str [6];
  undefined1 local_4c [4];
  char *pcStack_48;
  char rel_swizzle [4];
  char *local_40;
  
  pcVar7 = acStack_98;
  *buf = '\0';
  pcVar9 = "";
  switch(ctx->source_args[idx].src_mod) {
  case SRCMOD_NEGATE:
    local_40 = "-";
    goto LAB_0011cbac;
  case SRCMOD_BIAS:
    local_40 = "(";
    goto LAB_0011cc01;
  case SRCMOD_BIASNEGATE:
    local_40 = "-(";
LAB_0011cc01:
    pcStack_48 = " - 0.5)";
    goto LAB_0011cc61;
  case SRCMOD_SIGN:
    local_40 = "((";
    goto LAB_0011cbde;
  case SRCMOD_SIGNNEGATE:
    local_40 = "-((";
LAB_0011cbde:
    pcStack_48 = " - 0.5) * 2.0)";
    goto LAB_0011cc61;
  case SRCMOD_COMPLEMENT:
    local_40 = "(1.0 - ";
    break;
  case SRCMOD_X2:
    local_40 = "(";
    goto LAB_0011cc31;
  case SRCMOD_X2NEGATE:
    local_40 = "-(";
LAB_0011cc31:
    pcStack_48 = " * 2.0)";
    goto LAB_0011cc61;
  case SRCMOD_DZ:
    pcVar9 = "SRCMOD_DZ unsupported";
    goto LAB_0011cdf5;
  case SRCMOD_DW:
    pcVar9 = "SRCMOD_DW unsupported";
LAB_0011cdf5:
    uStack_a0 = 0x11cdfc;
    failf(ctx,"%s",pcVar9);
    return buf;
  case SRCMOD_ABS:
    ctx->metal_need_header_math = 1;
    local_40 = "abs(";
    break;
  case SRCMOD_ABSNEGATE:
    ctx->metal_need_header_math = 1;
    local_40 = "-abs(";
    break;
  case SRCMOD_NOT:
    local_40 = "!";
LAB_0011cbac:
    pcStack_48 = "";
    goto LAB_0011cc61;
  default:
    pcStack_48 = "";
    local_40 = "";
    goto LAB_0011cc61;
  }
  pcStack_48 = ")";
LAB_0011cc61:
  if (ctx->source_args[idx].relative == 0) {
    pcVar12 = local_d8;
    pcVar9 = acStack_98;
    pcVar7 = get_D3D_register_string
                       (ctx,ctx->source_args[idx].regtype,ctx->source_args[idx].regnum,pcVar9,
                        0x12b0a7);
    snprintf(pcVar12,0x40,"%s%s",pcVar7);
    rel_offset[8] = '\0';
    rel_offset[9] = '\0';
    rel_offset[10] = '\0';
    rel_offset[0xb] = '\0';
    rel_offset[0xc] = '\0';
    rel_offset[0xd] = '\0';
    rel_offset[0xe] = '\0';
    rel_offset[0xf] = '\0';
    rel_offset[0x10] = '\0';
    rel_offset[0x11] = '\0';
    rel_offset[0x12] = '\0';
    rel_offset[0x13] = '\0';
    rel_offset[0x14] = '\0';
    rel_offset[0x15] = '\0';
    rel_offset[0x16] = '\0';
    rel_offset[0x17] = '\0';
    acStack_98[0] = '\0';
    acStack_98[1] = '\0';
    acStack_98[2] = '\0';
    acStack_98[3] = '\0';
    acStack_98[4] = '\0';
    acStack_98[5] = '\0';
    acStack_98[6] = '\0';
    acStack_98[7] = '\0';
    rel_offset[0] = '\0';
    rel_offset[1] = '\0';
    rel_offset[2] = '\0';
    rel_offset[3] = '\0';
    rel_offset[4] = '\0';
    rel_offset[5] = '\0';
    rel_offset[6] = '\0';
    rel_offset[7] = '\0';
    local_4c = (undefined1  [4])0x0;
    pcVar7 = pcVar12;
    if (ctx->source_args[idx].relative == 0) {
      pcVar10 = "";
      pcVar13 = "";
      pcVar7 = "";
      pcVar9 = pcVar12;
      goto LAB_0011ce88;
    }
  }
  local_4c = (undefined1  [4])0x0;
  rel_offset[0x10] = '\0';
  rel_offset[0x11] = '\0';
  rel_offset[0x12] = '\0';
  rel_offset[0x13] = '\0';
  rel_offset[0x14] = '\0';
  rel_offset[0x15] = '\0';
  rel_offset[0x16] = '\0';
  rel_offset[0x17] = '\0';
  rel_offset[8] = '\0';
  rel_offset[9] = '\0';
  rel_offset[10] = '\0';
  rel_offset[0xb] = '\0';
  rel_offset[0xc] = '\0';
  rel_offset[0xd] = '\0';
  rel_offset[0xe] = '\0';
  rel_offset[0xf] = '\0';
  rel_offset[0] = '\0';
  rel_offset[1] = '\0';
  rel_offset[2] = '\0';
  rel_offset[3] = '\0';
  rel_offset[4] = '\0';
  rel_offset[5] = '\0';
  rel_offset[6] = '\0';
  rel_offset[7] = '\0';
  acStack_98[0] = '\0';
  acStack_98[1] = '\0';
  acStack_98[2] = '\0';
  acStack_98[3] = '\0';
  acStack_98[4] = '\0';
  acStack_98[5] = '\0';
  acStack_98[6] = '\0';
  acStack_98[7] = '\0';
  RVar1 = ctx->source_args[idx].regtype;
  if (RVar1 == REG_TYPE_CONST) {
    pVVar4 = ctx->source_args[idx].relative_array;
    uVar3 = pVVar4->index;
    uVar2 = ctx->source_args[idx].regnum;
    uVar11 = uVar2 - uVar3;
    if ((int)uVar11 < 0) {
      *(code **)(pcVar7 + -8) = make_METAL_swizzle_string;
      __assert_fail("offset >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x1128,
                    "const char *make_METAL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                   );
    }
    if (pVVar4->constant == (ConstantsList *)0x0) {
      pcVar7[-0x48] = -0x4f;
      pcVar7[-0x47] = -0x33;
      pcVar7[-0x46] = '\x11';
      pcVar7[-0x45] = '\0';
      pcVar7[-0x44] = '\0';
      pcVar7[-0x43] = '\0';
      pcVar7[-0x42] = '\0';
      pcVar7[-0x41] = '\0';
      snprintf(pcVar7 + -0x40,0x40,"uniforms.uniforms_%s","float4");
      if (uVar2 == uVar3) {
        pcVar12 = "ARRAYBASE_%d + ";
        goto LAB_0011cdcc;
      }
      pcVar9 = (char *)(ulong)uVar11;
      pcVar7[-0x48] = '!';
      pcVar7[-0x47] = -0x32;
      pcVar7[-0x46] = '\x11';
      pcVar7[-0x45] = '\0';
      pcVar7[-0x44] = '\0';
      pcVar7[-0x43] = '\0';
      pcVar7[-0x42] = '\0';
      pcVar7[-0x41] = '\0';
      snprintf(acStack_98,0x20,"(ARRAYBASE_%d + %d) + ",(ulong)uVar3);
    }
    else {
      pcVar9 = (char *)(ulong)(uint)pVVar4->count;
      pcVar7[-0x48] = 'i';
      pcVar7[-0x47] = -0x33;
      pcVar7[-0x46] = '\x11';
      pcVar7[-0x45] = '\0';
      pcVar7[-0x44] = '\0';
      pcVar7[-0x43] = '\0';
      pcVar7[-0x42] = '\0';
      pcVar7[-0x41] = '\0';
      snprintf(pcVar7 + -0x40,0x40,"const_array_%d_%d",(ulong)uVar3);
      if (uVar2 != uVar3) {
        pcVar12 = "%d + ";
        uVar3 = uVar11;
LAB_0011cdcc:
        pcVar7[-0x48] = -0x2d;
        pcVar7[-0x47] = -0x33;
        pcVar7[-0x46] = '\x11';
        pcVar7[-0x45] = '\0';
        pcVar7[-0x44] = '\0';
        pcVar7[-0x43] = '\0';
        pcVar7[-0x42] = '\0';
        pcVar7[-0x41] = '\0';
        snprintf(acStack_98,0x20,pcVar12,(ulong)uVar3);
      }
    }
  }
  else {
    if (RVar1 != REG_TYPE_INPUT) {
      pcVar7[-8] = '-';
      pcVar7[-7] = -0x31;
      pcVar7[-6] = '\x11';
      pcVar7[-5] = '\0';
      pcVar7[-4] = '\0';
      pcVar7[-3] = '\0';
      pcVar7[-2] = '\0';
      pcVar7[-1] = '\0';
      __assert_fail("arg->regtype == REG_TYPE_CONST",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x1125,
                    "const char *make_METAL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                   );
    }
    builtin_strncpy(pcVar7 + -0x40,"vertex_input_array",0x13);
  }
  RVar1 = ctx->source_args[idx].relative_regtype;
  iVar8 = ctx->source_args[idx].relative_regnum;
  pcVar12 = pcVar7 + -0x80;
  pcVar7[-0x88] = 'A';
  pcVar7[-0x87] = -0x32;
  pcVar7[-0x86] = '\x11';
  pcVar7[-0x85] = '\0';
  pcVar7[-0x84] = '\0';
  pcVar7[-0x83] = '\0';
  pcVar7[-0x82] = '\0';
  pcVar7[-0x81] = '\0';
  pcVar9 = get_D3D_register_string(ctx,RVar1,iVar8,local_68,(size_t)pcVar9);
  pcVar7[-0x88] = ']';
  pcVar7[-0x87] = -0x32;
  pcVar7[-0x86] = '\x11';
  pcVar7[-0x85] = '\0';
  pcVar7[-0x84] = '\0';
  pcVar7[-0x83] = '\0';
  pcVar7[-0x82] = '\0';
  pcVar7[-0x81] = '\0';
  snprintf(pcVar12,0x40,"%s%s",pcVar9,local_68);
  auVar5 = local_4c;
  local_4c[1] = "xyzw"[ctx->source_args[idx].relative_component];
  local_4c[0] = 0x2e;
  local_4c[3] = auVar5[3];
  local_4c[2] = 0;
  pcVar13 = "]";
  pcVar10 = "[";
  pcVar9 = pcVar7 + -0x40;
  pcVar7 = pcVar12;
LAB_0011ce88:
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  shader_type = ctx->shader_type;
  iVar8 = ctx->source_args[idx].regnum;
  RVar1 = ctx->source_args[idx].regtype;
  pcVar12[-8] = -0x5a;
  pcVar12[-7] = -0x32;
  pcVar12[-6] = '\x11';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  iVar6 = isscalar(ctx,shader_type,RVar1,iVar8);
  if (iVar6 == 0) {
    uVar3 = ctx->source_args[idx].swizzle;
    pcVar12[-8] = -0x47;
    pcVar12[-7] = -0x32;
    pcVar12[-6] = '\x11';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    make_METAL_swizzle_string(local_68,(ulong)uVar3,writemask,iVar8);
  }
  *(char **)(pcVar12 + -8) = pcStack_48;
  *(char **)(pcVar12 + -0x10) = local_68;
  *(char **)(pcVar12 + -0x18) = pcVar13;
  *(undefined1 **)(pcVar12 + -0x20) = local_4c;
  *(char **)(pcVar12 + -0x28) = pcVar7;
  *(char **)(pcVar12 + -0x30) = acStack_98;
  pcVar12[-0x38] = -8;
  pcVar12[-0x37] = -0x32;
  pcVar12[-0x36] = '\x11';
  pcVar12[-0x35] = '\0';
  pcVar12[-0x34] = '\0';
  pcVar12[-0x33] = '\0';
  pcVar12[-0x32] = '\0';
  pcVar12[-0x31] = '\0';
  snprintf(buf,0x40,"%s%s%s%s%s%s%s%s%s",local_40,pcVar9,pcVar10);
  return buf;
}

Assistant:

static const char *make_METAL_srcarg_string(Context *ctx, const size_t idx,
                                           const int writemask, char *buf,
                                           const size_t buflen)
{
    *buf = '\0';

    if (idx >= STATICARRAYLEN(ctx->source_args))
    {
        fail(ctx, "Too many source args");
        return buf;
    } // if

    const SourceArgInfo *arg = &ctx->source_args[idx];

    const char *premod_str = "";
    const char *postmod_str = "";
    switch (arg->src_mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_BIAS:
            premod_str = "(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_SIGN:
            premod_str = "((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_COMPLEMENT:
            premod_str = "(1.0 - ";
            postmod_str = ")";
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_X2:
            premod_str = "(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_DZ:
            fail(ctx, "SRCMOD_DZ unsupported"); return buf; // !!! FIXME
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            fail(ctx, "SRCMOD_DW unsupported"); return buf; // !!! FIXME
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            ctx->metal_need_header_math = 1;
            premod_str = "-abs(";
            postmod_str = ")";
            break;

        case SRCMOD_ABS:
            ctx->metal_need_header_math = 1;
            premod_str = "abs(";
            postmod_str = ")";
            break;

        case SRCMOD_NOT:
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch

    const char *regtype_str = NULL;

    if (!arg->relative)
    {
        regtype_str = get_METAL_varname_in_buf(ctx, arg->regtype, arg->regnum,
                                              (char *) alloca(64), 64);
    } // if

    const char *rel_lbracket = "";
    char rel_offset[32] = { '\0' };
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        if (arg->regtype == REG_TYPE_INPUT)
            regtype_str=get_METAL_input_array_varname(ctx,(char*)alloca(64),64);
        else
        {
            assert(arg->regtype == REG_TYPE_CONST);
            const int arrayidx = arg->relative_array->index;
            const int offset = arg->regnum - arrayidx;
            assert(offset >= 0);
            if (arg->relative_array->constant)
            {
                const int arraysize = arg->relative_array->count;
                regtype_str = get_METAL_const_array_varname_in_buf(ctx,
                                arrayidx, arraysize, (char *) alloca(64), 64);
                if (offset != 0)
                    snprintf(rel_offset, sizeof (rel_offset), "%d + ", offset);
            } // if
            else
            {
                regtype_str = get_METAL_uniform_array_varname(ctx, arg->regtype,
                                                      (char *) alloca(64), 64);
                if (offset == 0)
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "ARRAYBASE_%d + ", arrayidx);
                } // if
                else
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "(ARRAYBASE_%d + %d) + ", arrayidx, offset);
                } // else
            } // else
        } // else

        rel_lbracket = "[";

        rel_regtype_str = get_METAL_varname_in_buf(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  (char *) alloca(64), 64);
        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';
        rel_rbracket = "]";
    } // if

    char swiz_str[6] = { '\0' };
    if (!isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum))
    {
        make_METAL_swizzle_string(swiz_str, sizeof (swiz_str),
                                 arg->swizzle, writemask);
    } // if

    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown source register type.");
        return buf;
    } // if

    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s",
             premod_str, regtype_str, rel_lbracket, rel_offset,
             rel_regtype_str, rel_swizzle, rel_rbracket, swiz_str,
             postmod_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}